

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

uchar * nvpair_unpack_nvlist_array
                  (_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp,nvlist_t **firstel)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  undefined8 *__ptr;
  nvlist_t *data;
  nvpair_t *ele;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  if (nvp->nvp_type != 0xb) {
    __assert_fail("nvp->nvp_type == 11",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x428,
                  "const unsigned char *nvpair_unpack_nvlist_array(_Bool, nvpair_t *, const unsigned char *, size_t *, nvlist_t **)"
                 );
  }
  uVar4 = nvp->nvp_nitems;
  uVar2 = uVar4 * 0x13;
  if ((uVar4 - 1 < uVar2) && (uVar2 < *leftp || uVar2 - *leftp == 0)) {
    __ptr = (undefined8 *)malloc(uVar4 * 8);
    uVar5 = 0;
    if (__ptr != (undefined8 *)0x0) {
      while( true ) {
        uVar2 = (ulong)uVar5;
        if (uVar4 <= uVar2) {
          nvlist_set_flags((nvlist_t *)__ptr[uVar4 - 1],0x100);
          nvp->nvp_data = (uint64_t)__ptr;
          *firstel = (nvlist_t *)*__ptr;
          return ptr;
        }
        data = nvlist_create(0);
        __ptr[uVar2] = data;
        if (data == (nvlist_t *)0x0) break;
        if (uVar2 != 0) {
          ele = nvpair_allocv(" ",5,(uint64_t)data,0,0);
          if (ele == (nvpair_t *)0x0) break;
          nvlist_set_array_next((nvlist_t *)__ptr[uVar5 - 1],ele);
        }
        uVar5 = uVar5 + 1;
        uVar4 = nvp->nvp_nitems;
      }
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      for (uVar6 = 0; uVar6 <= uVar5; uVar6 = uVar6 + 1) {
        nvlist_destroy((nvlist_t *)__ptr[uVar6]);
      }
      free(__ptr);
      *piVar3 = iVar1;
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_nvlist_array(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp, nvlist_t **firstel)
{
	nvlist_t **value;
	nvpair_t *tmpnvp;
	unsigned int ii, j;
	size_t sizeup;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_NVLIST_ARRAY);

	sizeup = sizeof(struct nvpair_header) * nvp->nvp_nitems;
	if (nvp->nvp_nitems == 0 || sizeup < nvp->nvp_nitems ||
	    sizeup > *leftp) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nv_malloc(nvp->nvp_nitems * sizeof(*value));
	if (value == NULL)
		return (NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		value[ii] = nvlist_create(0);
		if (value[ii] == NULL)
			goto fail;
		if (ii > 0) {
			tmpnvp = nvpair_allocv(" ", NV_TYPE_NVLIST,
			    (uint64_t)(uintptr_t)value[ii], 0, 0);
			if (tmpnvp == NULL)
				goto fail;
			nvlist_set_array_next(value[ii - 1], tmpnvp);
		}
	}
	nvlist_set_flags(value[nvp->nvp_nitems - 1], NV_FLAG_IN_ARRAY);

	nvp->nvp_data = (uint64_t)(uintptr_t)value;
	*firstel = value[0];

	return (ptr);
fail:
	ERRNO_SAVE();
	for (j = 0; j <= ii; j++)
		nvlist_destroy(value[j]);
	nv_free(value);
	ERRNO_RESTORE();

	return (NULL);
}